

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClearIniSettings(void)

{
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Var1;
  ImGuiContext *this;
  ImGuiSettingsHandler *pIVar2;
  int handler_n;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  ImGuiContext *in_stack_ffffffffffffffe0;
  int local_c;
  
  this = GImGui;
  ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1cead4);
  for (local_c = 0; local_c < (this->SettingsHandlers).Size; local_c = local_c + 1) {
    pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                       ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffffe0,
                        in_stack_ffffffffffffffdc);
    if (pIVar2->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                         ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffffe0,
                          in_stack_ffffffffffffffdc);
      p_Var1 = pIVar2->ClearAllFn;
      in_stack_ffffffffffffffe0 = this;
      pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                         ((ImVector<ImGuiSettingsHandler> *)this,in_stack_ffffffffffffffdc);
      (*p_Var1)(in_stack_ffffffffffffffe0,pIVar2);
    }
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ClearAllFn)
            g.SettingsHandlers[handler_n].ClearAllFn(&g, &g.SettingsHandlers[handler_n]);
}